

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

bool slang::ast::Expression::collectArgs
               (ASTContext *context,ArgumentListSyntax *syntax,
               SmallVectorBase<const_slang::syntax::SyntaxNode_*> *orderedArgs,
               NamedArgMap *namedArgs)

{
  char *pcVar1;
  SyntaxKind SVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  NamedArgumentSyntax *this;
  uint64_t hash;
  SourceLocation SVar7;
  Diagnostic *this_00;
  long lVar8;
  ulong uVar9;
  ulong pos0;
  ulong uVar10;
  ulong uVar11;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ParentList *pPVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  string_view name;
  const_iterator __begin2;
  try_emplace_args_t local_f1;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_f0;
  ulong local_e8;
  ParentList *local_e0;
  string_view local_d8;
  iterator_base<const_slang::syntax::ArgumentSyntax_*> local_c8;
  NamedArgMap *local_b8;
  ASTContext *local_b0;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> *local_a8;
  Token local_a0;
  uint64_t local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  pair<const_slang::syntax::NamedArgumentSyntax_*,_bool> local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  pPVar12 = &syntax->parameters;
  local_c8.index = 0;
  uVar9 = (syntax->parameters).elements._M_extent._M_extent_value + 1 >> 1;
  local_f0 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
             &(namedArgs->super_Storage).field_0x108;
  local_e8 = uVar9;
  local_e0 = pPVar12;
  local_c8.list = pPVar12;
  local_b8 = namedArgs;
  local_b0 = context;
  local_a8 = orderedArgs;
  do {
    bVar13 = local_c8.list == pPVar12 && local_c8.index == uVar9;
    if (bVar13) {
      return bVar13;
    }
    this = (NamedArgumentSyntax *)
           slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::
           iterator_base<const_slang::syntax::ArgumentSyntax_*>::dereference(&local_c8);
    SVar2 = (this->super_ArgumentSyntax).super_SyntaxNode.kind;
    if (SVar2 == NamedArgument) {
      local_d8 = parsing::Token::valueText(&this->name);
      if (local_d8._M_len != 0) {
        local_68.second = false;
        local_68.first = this;
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (local_f0,&local_d8);
        pos0 = hash >> (namedArgs->field_0x110 & 0x3f);
        lVar8 = (hash & 0xff) * 4;
        cVar15 = (&UNK_0042856c)[lVar8];
        cVar16 = (&UNK_0042856d)[lVar8];
        cVar17 = (&UNK_0042856e)[lVar8];
        bVar18 = (&UNK_0042856f)[lVar8];
        uVar11 = (ulong)((uint)hash & 7);
        uVar10 = 0;
        uVar9 = pos0;
        cVar19 = cVar15;
        cVar20 = cVar16;
        cVar21 = cVar17;
        bVar22 = bVar18;
        cVar23 = cVar15;
        cVar24 = cVar16;
        cVar25 = cVar17;
        bVar26 = bVar18;
        cVar27 = cVar15;
        cVar28 = cVar16;
        cVar29 = cVar17;
        bVar30 = bVar18;
        do {
          lVar8 = *(long *)&namedArgs->field_0x120;
          pcVar1 = (char *)(lVar8 + uVar9 * 0x10);
          local_48 = *pcVar1;
          cStack_47 = pcVar1[1];
          cStack_46 = pcVar1[2];
          bStack_45 = pcVar1[3];
          cStack_44 = pcVar1[4];
          cStack_43 = pcVar1[5];
          cStack_42 = pcVar1[6];
          bStack_41 = pcVar1[7];
          cStack_40 = pcVar1[8];
          cStack_3f = pcVar1[9];
          cStack_3e = pcVar1[10];
          bStack_3d = pcVar1[0xb];
          cStack_3c = pcVar1[0xc];
          cStack_3b = pcVar1[0xd];
          cStack_3a = pcVar1[0xe];
          bVar5 = pcVar1[0xf];
          auVar14[0] = -(local_48 == cVar15);
          auVar14[1] = -(cStack_47 == cVar16);
          auVar14[2] = -(cStack_46 == cVar17);
          auVar14[3] = -(bStack_45 == bVar18);
          auVar14[4] = -(cStack_44 == cVar19);
          auVar14[5] = -(cStack_43 == cVar20);
          auVar14[6] = -(cStack_42 == cVar21);
          auVar14[7] = -(bStack_41 == bVar22);
          auVar14[8] = -(cStack_40 == cVar23);
          auVar14[9] = -(cStack_3f == cVar24);
          auVar14[10] = -(cStack_3e == cVar25);
          auVar14[0xb] = -(bStack_3d == bVar26);
          auVar14[0xc] = -(cStack_3c == cVar27);
          auVar14[0xd] = -(cStack_3b == cVar28);
          auVar14[0xe] = -(cStack_3a == cVar29);
          auVar14[0xf] = -(bVar5 == bVar30);
          uVar6 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
          bStack_39 = bVar5;
          if (uVar6 != 0) {
            lVar3 = *(long *)&namedArgs->field_0x128;
            local_88 = hash;
            local_80 = uVar11;
            local_78 = uVar10;
            local_70 = uVar9;
            local_58 = cVar15;
            cStack_57 = cVar16;
            cStack_56 = cVar17;
            bStack_55 = bVar18;
            cStack_54 = cVar19;
            cStack_53 = cVar20;
            cStack_52 = cVar21;
            bStack_51 = bVar22;
            cStack_50 = cVar23;
            cStack_4f = cVar24;
            cStack_4e = cVar25;
            bStack_4d = bVar26;
            cStack_4c = cVar27;
            cStack_4b = cVar28;
            cStack_4a = cVar29;
            bStack_49 = bVar30;
            do {
              iVar4 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              __y = (basic_string_view<char,_std::char_traits<char>_> *)
                    ((ulong)(uint)(iVar4 << 5) + lVar3 + uVar9 * 0x1e0);
              bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)local_f0,&local_d8,__y);
              if (bVar13) {
                SVar7 = parsing::Token::location(&this->name);
                this_00 = ASTContext::addDiag(local_b0,(DiagCode)0x4a0007,SVar7);
                Diagnostic::operator<<(this_00,local_d8);
                SVar7 = parsing::Token::location((Token *)(__y[1]._M_len + 0x28));
                Diagnostic::addNote(this_00,(DiagCode)0xc0001,SVar7);
                uVar9 = local_e8;
                namedArgs = local_b8;
                pPVar12 = local_e0;
                goto LAB_003c6659;
              }
              uVar6 = uVar6 - 1 & uVar6;
            } while (uVar6 != 0);
            bVar5 = *(byte *)(lVar8 + uVar9 * 0x10 + 0xf);
            uVar9 = local_70;
            uVar10 = local_78;
            uVar11 = local_80;
            hash = local_88;
            namedArgs = local_b8;
            cVar15 = local_58;
            cVar16 = cStack_57;
            cVar17 = cStack_56;
            bVar18 = bStack_55;
            cVar19 = cStack_54;
            cVar20 = cStack_53;
            cVar21 = cStack_52;
            bVar22 = bStack_51;
            cVar23 = cStack_50;
            cVar24 = cStack_4f;
            cVar25 = cStack_4e;
            bVar26 = bStack_4d;
            cVar27 = cStack_4c;
            cVar28 = cStack_4b;
            cVar29 = cStack_4a;
            bVar30 = bStack_49;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar11] & bVar5) == 0) break;
          lVar8 = uVar9 + uVar10;
          uVar10 = uVar10 + 1;
          uVar9 = lVar8 + 1U & *(ulong *)&namedArgs->field_0x118;
        } while (uVar10 <= *(ulong *)&namedArgs->field_0x118);
        if (*(ulong *)&namedArgs->field_0x138 < *(ulong *)&namedArgs->field_0x130) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>
                    ((locator *)&local_a0,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                      *)local_f0,pos0,hash,&local_f1,&local_d8,&local_68);
          uVar9 = local_e8;
          pPVar12 = local_e0;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>
                    ((locator *)&local_a0,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedArgumentSyntax_const*,bool>>,256ul,16ul>>
                      *)local_f0,hash,&local_f1,&local_d8,&local_68);
          uVar9 = local_e8;
          pPVar12 = local_e0;
        }
      }
    }
    else {
      if (*(long *)&namedArgs->field_0x138 != 0) {
        local_a0 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this);
        SVar7 = parsing::Token::location(&local_a0);
        ASTContext::addDiag(local_b0,(DiagCode)0x720007,SVar7);
        return bVar13;
      }
      if (SVar2 != EmptyArgument) {
        this = *(NamedArgumentSyntax **)&this->dot;
      }
      local_a0._0_8_ = this;
      SmallVectorBase<slang::syntax::SyntaxNode_const*>::
      emplace_back<slang::syntax::SyntaxNode_const*>
                ((SmallVectorBase<slang::syntax::SyntaxNode_const*> *)local_a8,
                 (SyntaxNode **)&local_a0);
    }
LAB_003c6659:
    local_c8.index = local_c8.index + 1;
  } while( true );
}

Assistant:

bool Expression::collectArgs(const ASTContext& context, const ArgumentListSyntax& syntax,
                             SmallVectorBase<const SyntaxNode*>& orderedArgs,
                             NamedArgMap& namedArgs) {
    // Collect all arguments into a list of ordered expressions (which can
    // optionally be nullptr to indicate an empty argument) and a map of
    // named argument assignments.
    for (auto arg : syntax.parameters) {
        if (arg->kind == SyntaxKind::NamedArgument) {
            const NamedArgumentSyntax& nas = arg->as<NamedArgumentSyntax>();
            auto name = nas.name.valueText();
            if (!name.empty()) {
                auto pair = namedArgs.emplace(name, std::make_pair(&nas, false));
                if (!pair.second) {
                    auto& diag = context.addDiag(diag::DuplicateArgAssignment, nas.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
        else {
            // Once a named argument has been seen, no more ordered arguments are allowed.
            if (!namedArgs.empty()) {
                context.addDiag(diag::MixingOrderedAndNamedArgs, arg->getFirstToken().location());
                return false;
            }

            if (arg->kind == SyntaxKind::EmptyArgument)
                orderedArgs.push_back(arg);
            else
                orderedArgs.push_back(arg->as<OrderedArgumentSyntax>().expr);
        }
    }
    return true;
}